

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

float Catch::anon_unknown_1::step<float>(float start,float direction,uint64_t steps)

{
  ulong in_RDI;
  float in_XMM0_Da;
  double dVar1;
  uint in_XMM1_Da;
  uint64_t i;
  undefined8 local_18;
  undefined4 local_4;
  
  local_4 = in_XMM0_Da;
  for (local_18 = 0; local_18 < in_RDI; local_18 = local_18 + 1) {
    dVar1 = clara::std::nextafter((double)(ulong)(uint)local_4,(double)(ulong)in_XMM1_Da);
    local_4 = SUB84(dVar1,0);
  }
  return local_4;
}

Assistant:

FP step(FP start, FP direction, uint64_t steps) {
    for (uint64_t i = 0; i < steps; ++i) {
#if defined(CATCH_CONFIG_GLOBAL_NEXTAFTER)
        start = Catch::nextafter(start, direction);
#else
        start = std::nextafter(start, direction);
#endif
    }
    return start;
}